

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric_stats.cpp
# Opt level: O2

FilterPropagateResult __thiscall
duckdb::CheckZonemapTemplated<unsigned_char>
          (duckdb *this,BaseStatistics *stats,ExpressionType comparison_type,
          array_ptr<duckdb::Value,_true> constants)

{
  duckdb min_value;
  duckdb max_value;
  uint8_t constant;
  FilterPropagateResult FVar1;
  Value *this_00;
  Value *pVVar2;
  undefined7 in_register_00000011;
  array_ptr_iterator<duckdb::Value> __begin2;
  array_ptr_iterator<duckdb::Value> local_48;
  
  pVVar2 = constants.ptr;
  min_value = this[0x30];
  max_value = this[0x40];
  local_48.index = 0;
  local_48.ptr = (Value *)CONCAT71(in_register_00000011,comparison_type);
  local_48.size = (idx_t)pVVar2;
  while( true ) {
    if ((Value *)local_48.size == pVVar2 &&
        ((Value *)local_48.index == pVVar2 &&
        local_48.ptr == (Value *)CONCAT71(in_register_00000011,comparison_type))) {
      return FILTER_ALWAYS_FALSE;
    }
    this_00 = array_ptr_iterator<duckdb::Value>::operator*(&local_48);
    constant = Value::GetValueUnsafe<unsigned_char>(this_00);
    FVar1 = CheckZonemapTemplated<unsigned_char>
                      ((BaseStatistics *)this,(ExpressionType)stats,(uchar)min_value,
                       (uchar)max_value,constant);
    if (FVar1 < FILTER_ALWAYS_FALSE) break;
    local_48.index = (idx_t)&((LogicalType *)local_48.index)->physical_type_;
    if (local_48.size <= local_48.index) {
      local_48.index = local_48.size;
    }
  }
  return FVar1;
}

Assistant:

FilterPropagateResult CheckZonemapTemplated(const BaseStatistics &stats, ExpressionType comparison_type,
                                            array_ptr<Value> constants) {
	T min_value = NumericStats::GetMinUnsafe<T>(stats);
	T max_value = NumericStats::GetMaxUnsafe<T>(stats);
	for (auto &constant_value : constants) {
		D_ASSERT(constant_value.type() == stats.GetType());
		D_ASSERT(!constant_value.IsNull());
		T constant = constant_value.GetValueUnsafe<T>();
		auto prune_result = CheckZonemapTemplated(stats, comparison_type, min_value, max_value, constant);
		if (prune_result == FilterPropagateResult::NO_PRUNING_POSSIBLE) {
			return FilterPropagateResult::NO_PRUNING_POSSIBLE;
		} else if (prune_result == FilterPropagateResult::FILTER_ALWAYS_TRUE) {
			return FilterPropagateResult::FILTER_ALWAYS_TRUE;
		}
	}
	return FilterPropagateResult::FILTER_ALWAYS_FALSE;
}